

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int64_t float128_to_int64_round_to_zero_s390x(float128 a,float_status *status)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = a.high;
  uVar4 = a.low;
  uVar6 = a.high._6_2_ & 0x7fff;
  uVar1 = (uVar3 & 0xffffffffffff) + 0x1000000000000;
  uVar7 = uVar1;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    uVar7 = uVar3 & 0xffffffffffff;
  }
  bVar2 = (byte)(uVar6 - 0x402f);
  if (uVar6 < 0x4030) {
    if (uVar6 < 0x3fff) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0 ||
          uVar7 != 0) || uVar4 != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x20;
      }
      return 0;
    }
    uVar7 = uVar1 >> (0x2fU - (char)uVar6 & 0x3f);
    if (uVar4 == 0) {
      if (uVar6 - 0x402f == 0) goto LAB_00c902d5;
      lVar5 = uVar1 << (bVar2 & 0x3f);
      goto joined_r0x00c90313;
    }
  }
  else {
    if (0x403d < uVar6) {
      if (uVar4 >> 0x31 == 0 && uVar3 == 0xc03e000000000000) {
        if (uVar4 != 0) {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
        return -0x8000000000000000;
      }
      status->float_exception_flags = status->float_exception_flags | 1;
      if (-1 < (long)uVar3) {
        return 0x7fffffffffffffff;
      }
      if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          uVar4 != 0) && uVar6 == 0x7fff) {
        return 0x7fffffffffffffff;
      }
      return -0x8000000000000000;
    }
    uVar7 = uVar4 >> (0x2fU - a.high._6_1_ & 0x3f) | uVar1 << (bVar2 & 0x3f);
    lVar5 = uVar4 << (bVar2 & 0x3f);
joined_r0x00c90313:
    if (lVar5 == 0) goto LAB_00c902d5;
  }
  status->float_exception_flags = status->float_exception_flags | 0x20;
LAB_00c902d5:
  uVar1 = -uVar7;
  if (-1 < (long)uVar3) {
    uVar1 = uVar7;
  }
  return uVar1;
}

Assistant:

int64_t float128_to_int64_round_to_zero(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;
    int64_t z;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = aExp - 0x402F;
    if ( 0 < shiftCount ) {
        if ( 0x403E <= aExp ) {
            aSig0 &= UINT64_C(0x0000FFFFFFFFFFFF);
            if (    ( a.high == UINT64_C(0xC03E000000000000) )
                 && ( aSig1 < UINT64_C(0x0002000000000000) ) ) {
                if (aSig1) {
                    status->float_exception_flags |= float_flag_inexact;
                }
            }
            else {
                float_raise(float_flag_invalid, status);
                if ( ! aSign || ( ( aExp == 0x7FFF ) && ( aSig0 | aSig1 ) ) ) {
                    return INT64_MAX;
                }
            }
            return INT64_MIN;
        }
        z = ( aSig0<<shiftCount ) | ( aSig1>>( ( - shiftCount ) & 63 ) );
        if ( (uint64_t) ( aSig1<<shiftCount ) ) {
            status->float_exception_flags |= float_flag_inexact;
        }
    }
    else {
        if ( aExp < 0x3FFF ) {
            if ( aExp | aSig0 | aSig1 ) {
                status->float_exception_flags |= float_flag_inexact;
            }
            return 0;
        }
        z = aSig0>>( - shiftCount );
        if (    aSig1
             || ( shiftCount && (uint64_t) ( aSig0<<( shiftCount & 63 ) ) ) ) {
            status->float_exception_flags |= float_flag_inexact;
        }
    }
    if ( aSign ) z = - z;
    return z;

}